

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional6::initObjects
          (PipelineStatisticsQueryTestFunctional6 *this)

{
  bool bVar1;
  RenderContext *pRVar2;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  PipelineStatisticsQueryTestFunctional6 *local_10;
  PipelineStatisticsQueryTestFunctional6 *this_local;
  
  local_10 = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.
                      m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::core(3,2);
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"OpenGL 3.2+ is required to run this test.",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional6::initObjects()
{
	/* This test should not execute if we're not running at least a GL3.2 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 2)))
	{
		throw tcu::NotSupportedError("OpenGL 3.2+ is required to run this test.");
	}
}